

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxCuesData.cpp
# Opt level: O0

bool __thiscall libmatroska::KaxCuePoint::IsSmallerThan(KaxCuePoint *this,EbmlElement *EltB)

{
  EbmlMaster *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EbmlElement *pEVar4;
  EbmlElement *pEVar5;
  KaxCueTrack *TrackB;
  KaxCueTrack *TrackA;
  KaxCueTime *TimeCodeB;
  KaxCueTime *TimeCodeA;
  KaxCuePoint *theEltB;
  size_t local_38;
  EbmlId local_30;
  EbmlMaster *local_20;
  EbmlElement *EltB_local;
  KaxCuePoint *this_local;
  
  local_20 = (EbmlMaster *)EltB;
  EltB_local = (EbmlElement *)this;
  iVar2 = (*(this->super_EbmlMaster).super_EbmlElement._vptr_EbmlElement[3])();
  local_30._0_8_ = *(undefined8 *)CONCAT44(extraout_var,iVar2);
  local_30.Length = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  bVar1 = libebml::EbmlId::operator==(&local_30,(EbmlId *)ClassInfos._8_8_);
  if (!bVar1) {
    __assert_fail("EbmlId(*this) == EBML_ID(KaxCuePoint)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxCuesData.cpp"
                  ,0x96,
                  "virtual bool libmatroska::KaxCuePoint::IsSmallerThan(const EbmlElement *) const")
    ;
  }
  iVar2 = (*(local_20->super_EbmlElement)._vptr_EbmlElement[3])();
  theEltB = *(KaxCuePoint **)CONCAT44(extraout_var_00,iVar2);
  local_38 = ((undefined8 *)CONCAT44(extraout_var_00,iVar2))[1];
  bVar1 = libebml::EbmlId::operator==((EbmlId *)&theEltB,(EbmlId *)ClassInfos._8_8_);
  this_00 = local_20;
  if (!bVar1) {
    __assert_fail("EbmlId(*EltB) == EBML_ID(KaxCuePoint)",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxCuesData.cpp"
                  ,0x97,
                  "virtual bool libmatroska::KaxCuePoint::IsSmallerThan(const EbmlElement *) const")
    ;
  }
  pEVar4 = libebml::EbmlMaster::FindElt
                     (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueTime::ClassInfos);
  if (pEVar4 == (EbmlElement *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pEVar5 = libebml::EbmlMaster::FindElt(this_00,(EbmlCallbacks *)KaxCueTime::ClassInfos);
    if (pEVar5 == (EbmlElement *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      uVar3 = (*pEVar4->_vptr_EbmlElement[0xc])(pEVar4,pEVar5);
      if ((uVar3 & 1) == 0) {
        uVar3 = (*pEVar5->_vptr_EbmlElement[0xc])(pEVar5,pEVar4);
        if ((uVar3 & 1) == 0) {
          pEVar4 = libebml::EbmlMaster::FindElt
                             (&this->super_EbmlMaster,(EbmlCallbacks *)KaxCueTrack::ClassInfos);
          if (pEVar4 == (EbmlElement *)0x0) {
            this_local._7_1_ = false;
          }
          else {
            pEVar5 = libebml::EbmlMaster::FindElt(this_00,(EbmlCallbacks *)KaxCueTrack::ClassInfos);
            if (pEVar5 == (EbmlElement *)0x0) {
              this_local._7_1_ = false;
            }
            else {
              uVar3 = (*pEVar4->_vptr_EbmlElement[0xc])(pEVar4,pEVar5);
              if ((uVar3 & 1) == 0) {
                uVar3 = (*pEVar5->_vptr_EbmlElement[0xc])(pEVar5,pEVar4);
                if ((uVar3 & 1) == 0) {
                  this_local._7_1_ = false;
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = true;
              }
            }
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool KaxCuePoint::IsSmallerThan(const EbmlElement * EltB) const
{
  assert(EbmlId(*this) == EBML_ID(KaxCuePoint));
  assert(EbmlId(*EltB) == EBML_ID(KaxCuePoint));

  const KaxCuePoint & theEltB = *static_cast<const KaxCuePoint *>(EltB);

  // compare timecode
  const KaxCueTime * TimeCodeA = static_cast<const KaxCueTime *>(FindElt(EBML_INFO(KaxCueTime)));
  if (TimeCodeA == NULL)
    return false;

  const KaxCueTime * TimeCodeB = static_cast<const KaxCueTime *>(theEltB.FindElt(EBML_INFO(KaxCueTime)));
  if (TimeCodeB == NULL)
    return false;

  if (TimeCodeA->IsSmallerThan(TimeCodeB))
    return true;

  if (TimeCodeB->IsSmallerThan(TimeCodeA))
    return false;

  // compare tracks (timecodes are equal)
  const KaxCueTrack * TrackA = static_cast<const KaxCueTrack *>(FindElt(EBML_INFO(KaxCueTrack)));
  if (TrackA == NULL)
    return false;

  const KaxCueTrack * TrackB = static_cast<const KaxCueTrack *>(theEltB.FindElt(EBML_INFO(KaxCueTrack)));
  if (TrackB == NULL)
    return false;

  if (TrackA->IsSmallerThan(TrackB))
    return true;

  if (TrackB->IsSmallerThan(TrackA))
    return false;

  return false;
}